

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastrender.h
# Opt level: O0

void __thiscall
SQCompilation::RenderVisitor::visitForStatement(RenderVisitor *this,ForStatement *loop)

{
  Node *pNVar1;
  Expr *pEVar2;
  ForStatement *in_RSI;
  RenderVisitor *in_RDI;
  Node *unaff_retaddr;
  RenderVisitor *visitor;
  
  visitor = in_RDI;
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  pNVar1 = ForStatement::initializer(in_RSI);
  if (pNVar1 != (Node *)0x0) {
    ForStatement::initializer(in_RSI);
    Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  }
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  pEVar2 = ForStatement::condition(in_RSI);
  if (pEVar2 != (Expr *)0x0) {
    ForStatement::condition(in_RSI);
    Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  }
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  pEVar2 = ForStatement::modifier(in_RSI);
  if (pEVar2 != (Expr *)0x0) {
    ForStatement::modifier(in_RSI);
    Node::visit<SQCompilation::RenderVisitor>(unaff_retaddr,visitor);
  }
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  in_RDI->_indent = in_RDI->_indent + 2;
  (*(in_RDI->super_Visitor)._vptr_Visitor[0x19])(in_RDI,in_RSI);
  in_RDI->_indent = in_RDI->_indent + -2;
  newLine((RenderVisitor *)0x122b78);
  indent((RenderVisitor *)in_RSI,(int)((ulong)in_RDI >> 0x20));
  OutputStream::writeString((OutputStream *)in_RSI,(char *)in_RDI);
  newLine((RenderVisitor *)0x122ba4);
  return;
}

Assistant:

virtual void visitForStatement(ForStatement *loop) {
      _out->writeString("FOR (");

        if (loop->initializer()) loop->initializer()->visit(this);
        _out->writeString("; ");

        if (loop->condition()) loop->condition()->visit(this);
        _out->writeString("; ");

        if (loop->modifier()) loop->modifier()->visit(this);
        _out->writeString(")\n");

        _indent += 2;
        visitLoopStatement(loop);
        _indent -= 2;

        newLine();

        indent(_indent);
        _out->writeString("END_FOR");
        newLine();
    }